

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# usda-reader.cc
# Opt level: O0

bool __thiscall
tinyusdz::usda::USDAReader::Impl::ReconstructPrim<tinyusdz::Xform>
          (Impl *this,Specifier *spec,PropertyMap *properties,ReferenceList *references,Xform *xform
          )

{
  undefined8 xform_00;
  bool bVar1;
  ostream *poVar2;
  string local_1f8;
  ostringstream local_1d8 [8];
  ostringstream ss_e;
  PrimReconstructOptions local_59;
  undefined1 local_58 [8];
  string err;
  Xform *xform_local;
  ReferenceList *references_local;
  PropertyMap *properties_local;
  Specifier *spec_local;
  Impl *this_local;
  
  err.field_2._8_8_ = xform;
  ::std::__cxx11::string::string((string *)local_58);
  xform_00 = err.field_2._8_8_;
  memset(&local_59,0,1);
  tinyusdz::prim::PrimReconstructOptions::PrimReconstructOptions(&local_59);
  bVar1 = tinyusdz::prim::ReconstructPrim<tinyusdz::Xform>
                    (spec,properties,references,(Xform *)xform_00,&this->_warn,(string *)local_58,
                     &local_59);
  bVar1 = ((bVar1 ^ 0xffU) & 1) != 0;
  if (bVar1) {
    ::std::__cxx11::ostringstream::ostringstream(local_1d8);
    poVar2 = ::std::operator<<((ostream *)local_1d8,"[error]");
    poVar2 = ::std::operator<<(poVar2,
                               "/workspace/llm4binary/github/license_c_cmakelists/syoyo[P]tinyusdz/src/usda-reader.cc"
                              );
    poVar2 = ::std::operator<<(poVar2,":");
    poVar2 = ::std::operator<<(poVar2,"ReconstructPrim");
    poVar2 = ::std::operator<<(poVar2,"():");
    poVar2 = (ostream *)::std::ostream::operator<<(poVar2,0x61e);
    ::std::operator<<(poVar2," ");
    poVar2 = ::std::operator<<((ostream *)local_1d8,"Failed to reconstruct Xform Prim: ");
    poVar2 = ::std::operator<<(poVar2,(string *)local_58);
    ::std::operator<<(poVar2,"\n");
    ::std::__cxx11::ostringstream::str();
    PushError(this,&local_1f8);
    ::std::__cxx11::string::~string((string *)&local_1f8);
    ::std::__cxx11::ostringstream::~ostringstream(local_1d8);
  }
  this_local._7_1_ = !bVar1;
  ::std::__cxx11::string::~string((string *)local_58);
  return this_local._7_1_;
}

Assistant:

bool USDAReader::Impl::ReconstructPrim(
    const Specifier &spec,
    const prim::PropertyMap &properties,
    const prim::ReferenceList &references,
    Xform *xform) {

  std::string err;
  if (!prim::ReconstructPrim(spec, properties, references, xform, &_warn, &err)) {
    PUSH_ERROR_AND_RETURN("Failed to reconstruct Xform Prim: " << err);
  }
  return true;
}